

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_enum_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::javanano::EnumFieldGenerator::GenerateMergingCode
          (EnumFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  Printer *printer_local;
  EnumFieldGenerator *this_local;
  
  io::Printer::Print(printer,&this->variables_,"int value = input.readInt32();\nswitch (value) {\n")
  ;
  anon_unknown_3::PrintCaseLabels(printer,&this->canonical_values_);
  io::Printer::Print(printer,&this->variables_,"    this.$name$ = value;\n");
  bVar1 = Params::generate_has((this->super_FieldGenerator).params_);
  if (bVar1) {
    io::Printer::Print(printer,&this->variables_,"    has$capitalized_name$ = true;\n");
  }
  io::Printer::Print(printer,"    break;\n}\n");
  return;
}

Assistant:

void EnumFieldGenerator::
GenerateMergingCode(io::Printer* printer) const {
  printer->Print(variables_,
    "int value = input.readInt32();\n"
    "switch (value) {\n");
  PrintCaseLabels(printer, canonical_values_);
  printer->Print(variables_,
    "    this.$name$ = value;\n");
  if (params_.generate_has()) {
    printer->Print(variables_,
      "    has$capitalized_name$ = true;\n");
  }
  printer->Print(
    "    break;\n"
    "}\n");
  // No default case: in case of invalid value from the wire, preserve old
  // field value. Also we are not storing the invalid value into the unknown
  // fields, because there is no way to get the value out.
}